

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_36::NetworkHttpClient::connect
          (NetworkHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  PromiseArena *pPVar1;
  char *pcVar2;
  long *plVar3;
  SourceLocation location;
  OwnPromiseNode OVar4;
  char *pcVar5;
  char *pcVar6;
  PromiseArenaMember *node;
  HttpClient node_00;
  PromiseBase node_01;
  NetworkHttpClient *pNVar7;
  _func_int **pp_Var8;
  Timer *pTVar9;
  void *pvVar10;
  _func_int *p_Var11;
  undefined8 *puVar12;
  _func_int **pp_Var13;
  undefined4 in_register_00000034;
  PromiseArena *pPVar14;
  long lVar15;
  char *in_R9;
  TransformPromiseNodeBase *this_00;
  RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>
  *ptrCopy_2;
  TransitionaryAsyncIoStream *ptrCopy;
  Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> addr;
  Own<kj::AsyncIoStream,_std::nullptr_t> connection;
  SplitTuplePromise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>_>
  split;
  OwnPromiseNode local_a0;
  SourceLocation local_98;
  PromiseArenaMember *local_80;
  HttpClient local_78;
  OwnPromiseNode local_70;
  PromiseBase local_68;
  PromiseArenaMember *local_60;
  NetworkHttpClient *local_58;
  OwnPromiseNode local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  pPVar14 = (PromiseArena *)CONCAT44(in_register_00000034,__fd);
  local_58 = this;
  if (*in_R9 == '\x01') {
    if (*(undefined8 **)(pPVar14->bytes + 0x28) == (undefined8 *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
                ((Fault *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x18b3,FAILED,"tlsNetwork != nullptr","\"this HttpClient doesn\'t support TLS\"",
                 (char (*) [36])"this HttpClient doesn\'t support TLS");
      kj::_::Debug::Fault::fatal((Fault *)&local_98);
    }
    (**(code **)**(undefined8 **)(pPVar14->bytes + 0x28))(&local_98);
  }
  else {
    (**(code **)**(undefined8 **)(pPVar14->bytes + 0x20))(&local_98);
  }
  local_a0.ptr = (PromiseNode *)local_98.fileName;
  pPVar1 = *(PromiseArena **)((long)local_98.fileName + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_98.fileName - (long)pPVar1) < 0x28) {
    pvVar10 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_a0,
               kj::(anonymous_namespace)::NetworkHttpClient::
               connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::
               {lambda(auto:1)#1}::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_007048d0;
    *(PromiseArena **)((long)pvVar10 + 0x3f8) = pPVar14;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  else {
    *(PromiseArena **)((long)local_98.fileName + 8) = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)((long)local_98.fileName + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_a0,
               kj::(anonymous_namespace)::NetworkHttpClient::
               connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::
               {lambda(auto:1)#1}::operator());
    ((PromiseArenaMember *)((long)local_98.fileName + -0x30))->arena =
         (PromiseArena *)&PTR_destroy_007048d0;
    ((PromiseArenaMember *)((long)local_98.fileName + -0x10))->arena = pPVar14;
    ((PromiseArenaMember *)((long)local_98.fileName + -0x20))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  local_98.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
  ;
  local_98.function = "then";
  local_98.lineNumber = 0x58b;
  local_98.columnNumber = 0x4c;
  local_50.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_60,&local_50,&local_98);
  OVar4.ptr = local_50.ptr;
  local_80 = local_60;
  if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
    local_50.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar4.ptr)->super_PromiseArenaMember);
  }
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_40 = "connect";
  local_38 = 0x28000018b9;
  location.function = "connect";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x18b9;
  location.columnNumber = 0x28;
  Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
  ::split((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
           *)&local_78,location);
  node = local_80;
  if (local_80 != (PromiseArenaMember *)0x0) {
    local_80 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  local_68.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_70.ptr;
  local_70.ptr = (PromiseNode *)0x0;
  newPromisedStream((kj *)&local_98,
                    (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_68);
  node_01.node.ptr = local_68.node.ptr;
  if (local_68.node.ptr != (PromiseNode *)0x0) {
    local_68.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_01.node.ptr);
  }
  if (((*in_R9 == '\0') && (lVar15 = *(long *)(pPVar14->bytes + 0x58), lVar15 != 0)) &&
     (pcVar2 = *(char **)(in_R9 + 8), pcVar2 != (char *)0x0)) {
    p_Var11 = (_func_int *)operator_new(0x20);
    pcVar6 = local_98.function;
    pcVar5 = local_98.fileName;
    local_98.function = (char *)0x0;
    *(undefined ***)p_Var11 = &PTR_read_007049c0;
    *(undefined ***)(p_Var11 + 8) = &PTR_write_00704a60;
    puVar12 = (undefined8 *)operator_new(0x30);
    *puVar12 = &PTR_read_00702380;
    puVar12[1] = &DAT_00702420;
    puVar12[2] = pcVar5;
    puVar12[3] = pcVar6;
    puVar12[4] = 0;
    *(undefined2 *)(puVar12 + 5) = 0;
    *(undefined8 **)(p_Var11 + 0x10) = &kj::_::HeapDisposer<kj::PausableReadAsyncIoStream>::instance
    ;
    *(undefined8 **)(p_Var11 + 0x18) = puVar12;
    pp_Var13 = (_func_int **)operator_new(0x20);
    *pp_Var13 = (_func_int *)&PTR_disposeImpl_00704980;
    pp_Var13[2] = (_func_int *)
                  &kj::_::HeapDisposer<kj::(anonymous_namespace)::TransitionaryAsyncIoStream>::
                   instance;
    pp_Var13[3] = p_Var11;
    *(undefined4 *)(pp_Var13 + 1) = 2;
    puVar12 = (undefined8 *)operator_new(0x20);
    pcVar5 = local_98.fileName;
    *puVar12 = &PTR_operator___00704ae0;
    puVar12[1] = lVar15;
    *(int *)(pp_Var13 + 1) = *(int *)(pp_Var13 + 1) + 1;
    puVar12[2] = pp_Var13;
    puVar12[3] = p_Var11;
    pp_Var8 = pp_Var13;
    pTVar9 = (Timer *)pp_Var13[3];
    if ((long *)local_98.function != (long *)0x0) {
      lVar15 = (long)local_98.function + *(long *)(*(long *)local_98.function + -0x10);
      p_Var11 = *(_func_int **)local_98.fileName;
      local_98.fileName = (char *)pp_Var13;
      local_98.function = (char *)pp_Var13[3];
      (**(code **)p_Var11)(pcVar5,lVar15);
      pp_Var8 = (_func_int **)local_98.fileName;
      pTVar9 = (Timer *)local_98.function;
    }
    local_98.function = (char *)pTVar9;
    local_98.fileName = (char *)pp_Var8;
    if (*pcVar2 == '\x01') {
      *pcVar2 = '\0';
      plVar3 = *(long **)(pcVar2 + 0x10);
      if (plVar3 != (long *)0x0) {
        pcVar2[0x10] = '\0';
        pcVar2[0x11] = '\0';
        pcVar2[0x12] = '\0';
        pcVar2[0x13] = '\0';
        pcVar2[0x14] = '\0';
        pcVar2[0x15] = '\0';
        pcVar2[0x16] = '\0';
        pcVar2[0x17] = '\0';
        (**(code **)**(undefined8 **)(pcVar2 + 8))
                  (*(undefined8 **)(pcVar2 + 8),(long)plVar3 + *(long *)(*plVar3 + -0x10));
      }
    }
    *(undefined8 **)(pcVar2 + 8) =
         &kj::_::
          HeapDisposer<kj::Function<kj::Promise<void>(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::NetworkHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::{lambda(kj::StringPtr)#1}>>
          ::instance;
    *(undefined8 **)(pcVar2 + 0x10) = puVar12;
    *pcVar2 = '\x01';
    (**(code **)*pp_Var13)(pp_Var13,(long)pp_Var13 + *(long *)(*pp_Var13 + -0x10));
  }
  pNVar7 = local_58;
  OVar4.ptr = (PromiseNode *)local_70;
  (local_58->super_HttpClient)._vptr_HttpClient = local_78._vptr_HttpClient;
  local_78._vptr_HttpClient = (_func_int **)0x0;
  (local_58->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_98.fileName;
  local_58->timer = (Timer *)local_98.function;
  if (&(local_70.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_70.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar4.ptr)->super_PromiseArenaMember);
  }
  node_00._vptr_HttpClient = local_78._vptr_HttpClient;
  if ((PromiseArenaMember *)local_78._vptr_HttpClient != (PromiseArenaMember *)0x0) {
    local_78._vptr_HttpClient = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00._vptr_HttpClient);
  }
  OVar4.ptr = local_a0.ptr;
  if (&(local_a0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_a0.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar4.ptr)->super_PromiseArenaMember);
  }
  return (int)pNVar7;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers,
      HttpConnectSettings connectSettings) override {
    // We want to connect directly instead of going through a proxy here.
    // https://github.com/capnproto/capnproto/pull/1454#discussion_r900414879
    kj::Maybe<kj::Promise<kj::Own<kj::NetworkAddress>>> addr;
    if (connectSettings.useTls) {
      kj::Network& tlsNet = KJ_REQUIRE_NONNULL(tlsNetwork, "this HttpClient doesn't support TLS");
      addr = tlsNet.parseAddress(host);
    } else {
      addr = network.parseAddress(host);
    }

    auto split = KJ_ASSERT_NONNULL(addr).then([this](auto address) {
      return address->connect().then([this](auto connection)
          -> kj::Tuple<kj::Promise<ConnectRequest::Status>,
                       kj::Promise<kj::Own<kj::AsyncIoStream>>> {
        return kj::tuple(
            ConnectRequest::Status(
              200,
              kj::str("OK"),
              kj::heap<kj::HttpHeaders>(responseHeaderTable) // Empty headers
            ),
            kj::mv(connection));
      }).attach(kj::mv(address));
    }).split();

    auto connection = kj::newPromisedStream(kj::mv(kj::get<1>(split)));

    if (!connectSettings.useTls) {
      KJ_IF_SOME(wrapper, settings.tlsContext) {
        KJ_IF_SOME(tlsStarter, connectSettings.tlsStarter) {
          auto transitConnectionRef = kj::refcountedWrapper(
              kj::heap<TransitionaryAsyncIoStream>(kj::mv(connection)));
          Function<kj::Promise<void>(kj::StringPtr)> cb =
              [&wrapper, ref1 = transitConnectionRef->addWrappedRef()](
              kj::StringPtr expectedServerHostname) mutable {
            ref1->startTls(&wrapper, expectedServerHostname);
            return kj::READY_NOW;
          };
          connection = transitConnectionRef->addWrappedRef();
          tlsStarter = kj::mv(cb);
        }
      }
    }

    return ConnectRequest {
      kj::mv(kj::get<0>(split)),
      kj::mv(connection)
    };
  }